

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lateral_binder.cpp
# Opt level: O3

void __thiscall
duckdb::ExpressionDepthReducerRecursive::VisitExpression
          (ExpressionDepthReducerRecursive *this,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expression)

{
  ExpressionType EVar1;
  pointer pCVar2;
  pointer pEVar3;
  BoundColumnRefExpression *pBVar4;
  BoundSubqueryExpression *expr;
  pointer pCVar5;
  
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (expression);
  EVar1 = (pEVar3->super_BaseExpression).type;
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (expression);
  if (EVar1 == BOUND_COLUMN_REF) {
    pBVar4 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>(&pEVar3->super_BaseExpression);
    pCVar5 = (this->correlated_columns->
             super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             ).
             super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar2 = (this->correlated_columns->
             super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             ).
             super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pCVar5 != pCVar2 && pBVar4->depth != 0) {
      do {
        if (((pCVar5->binding).table_index == (pBVar4->binding).table_index) &&
           ((pCVar5->binding).column_index == (pBVar4->binding).column_index)) {
          pBVar4->depth = pBVar4->depth - 1;
          break;
        }
        pCVar5 = pCVar5 + 1;
      } while (pCVar5 != pCVar2);
    }
  }
  else if ((pEVar3->super_BaseExpression).type == SUBQUERY) {
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(expression);
    expr = BaseExpression::Cast<duckdb::BoundSubqueryExpression>(&pEVar3->super_BaseExpression);
    ReduceExpressionSubquery(expr,this->correlated_columns);
  }
  BoundNodeVisitor::VisitExpression(&this->super_BoundNodeVisitor,expression);
  return;
}

Assistant:

void VisitExpression(unique_ptr<Expression> &expression) override {
		if (expression->GetExpressionType() == ExpressionType::BOUND_COLUMN_REF) {
			ReduceColumnRefDepth(expression->Cast<BoundColumnRefExpression>(), correlated_columns);
		} else if (expression->GetExpressionType() == ExpressionType::SUBQUERY) {
			ReduceExpressionSubquery(expression->Cast<BoundSubqueryExpression>(), correlated_columns);
		}
		BoundNodeVisitor::VisitExpression(expression);
	}